

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

void __thiscall TagConfiguration::TagConfiguration(TagConfiguration *this,Configuration *cfg)

{
  _Rb_tree_header *p_Var1;
  set<QString,_std::less<QString>,_std::allocator<QString>_> *this_00;
  QString *pQVar2;
  pointer pPVar3;
  TagVecOfTags *this_01;
  QString *str;
  QString *v;
  pointer pair;
  QLatin1String latin1;
  QLatin1String latin1_00;
  QLatin1String latin1_01;
  QLatin1String latin1_02;
  QLatin1String latin1_03;
  QLatin1String latin1_04;
  QLatin1String latin1_05;
  QLatin1String latin1_06;
  shared_ptr<TagVecOfTags> p;
  __shared_ptr<TagVecOfTags,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  latin1.m_data = "cfg";
  latin1.m_size = 3;
  QString::QString((QString *)&p,latin1);
  cfgfile::tag_no_value_t<cfgfile::qstring_trait_t>::tag_no_value_t
            (&this->super_tag_no_value_t<cfgfile::qstring_trait_t>,(string_t *)&p,true);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p);
  (this->super_tag_no_value_t<cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__TagConfiguration_0011b7f8;
  latin1_00.m_data = "stringValue";
  latin1_00.m_size = 0xb;
  QString::QString((QString *)&p,latin1_00);
  cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::tag_scalar_t
            (&this->m_stringValue,(tag_t<cfgfile::qstring_trait_t> *)this,(string_t *)&p,true);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p);
  (this->m_constraintForListOfStringValues).super_constraint_t<QString>._vptr_constraint_t =
       (_func_int **)&PTR__constraint_one_of_t_0011bce8;
  p_Var1 = &(this->m_constraintForListOfStringValues).m_list._M_t._M_impl.super__Rb_tree_header;
  (this->m_constraintForListOfStringValues).m_list._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->m_constraintForListOfStringValues).m_list._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->m_constraintForListOfStringValues).m_list._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->m_constraintForListOfStringValues).m_list._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->m_constraintForListOfStringValues).m_list._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  latin1_01.m_data = "listOfStringValues";
  latin1_01.m_size = 0x12;
  QString::QString((QString *)&p,latin1_01);
  cfgfile::tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t>::tag_scalar_vector_t
            (&this->m_listOfStringValues,(tag_t<cfgfile::qstring_trait_t> *)this,(string_t *)&p,true
            );
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p);
  (this->m_constriantForIntValue).super_constraint_t<int>._vptr_constraint_t =
       (_func_int **)&PTR__constraint_t_0011bc98;
  (this->m_constriantForIntValue).m_min = 0;
  (this->m_constriantForIntValue).m_max = 100;
  latin1_02.m_data = "intValue";
  latin1_02.m_size = 8;
  QString::QString((QString *)&p,latin1_02);
  cfgfile::tag_scalar_t<int,_cfgfile::qstring_trait_t>::tag_scalar_t
            (&this->m_intValue,(tag_t<cfgfile::qstring_trait_t> *)this,(string_t *)&p,true);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p);
  latin1_03.m_data = "vecOfTags";
  latin1_03.m_size = 9;
  QString::QString((QString *)&p,latin1_03);
  cfgfile::tag_vector_of_tags_t<TagVecOfTags,_cfgfile::qstring_trait_t>::tag_vector_of_tags_t
            (&this->m_vecOfTags,(tag_t<cfgfile::qstring_trait_t> *)this,(string_t *)&p,true);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p);
  latin1_04.m_data = "str1";
  latin1_04.m_size = 4;
  QString::QString((QString *)&p,latin1_04);
  this_00 = &(this->m_constraintForListOfStringValues).m_list;
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)this_00,(QString *)&p);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p);
  latin1_05.m_data = "str2";
  latin1_05.m_size = 4;
  QString::QString((QString *)&p,latin1_05);
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)this_00,(QString *)&p);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p);
  latin1_06.m_data = "str3";
  latin1_06.m_size = 4;
  QString::QString((QString *)&p,latin1_06);
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)this_00,(QString *)&p);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p);
  (this->m_listOfStringValues).m_constraint =
       &(this->m_constraintForListOfStringValues).super_constraint_t<QString>;
  (this->m_intValue).m_constraint = &(this->m_constriantForIntValue).super_constraint_t<int>;
  cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::set_value
            (&this->m_stringValue,&cfg->m_stringValue);
  pQVar2 = (cfg->m_listOfStringValues).super__Vector_base<QString,_std::allocator<QString>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (v = (cfg->m_listOfStringValues).super__Vector_base<QString,_std::allocator<QString>_>._M_impl
           .super__Vector_impl_data._M_start; v != pQVar2; v = v + 1) {
    cfgfile::tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t>::set_value
              (&this->m_listOfStringValues,v);
  }
  cfgfile::tag_scalar_t<int,_cfgfile::qstring_trait_t>::set_value
            (&this->m_intValue,&cfg->m_intValue);
  pPVar3 = (cfg->m_vectorOfTags).
           super__Vector_base<Configuration::Pair,_std::allocator<Configuration::Pair>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pair = (cfg->m_vectorOfTags).
              super__Vector_base<Configuration::Pair,_std::allocator<Configuration::Pair>_>._M_impl.
              super__Vector_impl_data._M_start; pair != pPVar3; pair = pair + 1) {
    this_01 = (TagVecOfTags *)operator_new(0x138);
    TagVecOfTags::TagVecOfTags(this_01,pair);
    std::__shared_ptr<TagVecOfTags,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<TagVecOfTags,void>
              ((__shared_ptr<TagVecOfTags,(__gnu_cxx::_Lock_policy)2> *)
               &p.super___shared_ptr<TagVecOfTags,_(__gnu_cxx::_Lock_policy)2>,this_01);
    std::__shared_ptr<TagVecOfTags,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&p.super___shared_ptr<TagVecOfTags,_(__gnu_cxx::_Lock_policy)2>);
    cfgfile::tag_vector_of_tags_t<TagVecOfTags,_cfgfile::qstring_trait_t>::set_value
              (&this->m_vecOfTags,(ptr_to_tag_t *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<TagVecOfTags,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  (this->super_tag_no_value_t<cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
  m_is_defined = true;
  return;
}

Assistant:

TagConfiguration::TagConfiguration( const Configuration & cfg )
	:	cfgfile::tag_no_value_t< cfgfile::qstring_trait_t >( QLatin1String( "cfg" ), true )
	,	m_stringValue( *this, QLatin1String( "stringValue" ), true )
	,	m_listOfStringValues( *this, QLatin1String( "listOfStringValues" ), true )
	,	m_constriantForIntValue( 0, 100 )
	,	m_intValue( *this, QLatin1String( "intValue" ), true )
	,	m_vecOfTags( *this, QLatin1String( "vecOfTags" ), true )
{
	m_constraintForListOfStringValues.add_value( QLatin1String( "str1" ) );
	m_constraintForListOfStringValues.add_value( QLatin1String( "str2" ) );
	m_constraintForListOfStringValues.add_value( QLatin1String( "str3" ) );

	m_listOfStringValues.set_constraint( &m_constraintForListOfStringValues );
	m_intValue.set_constraint( &m_constriantForIntValue );

	m_stringValue.set_value( cfg.m_stringValue );

	for( const auto & str : cfg.m_listOfStringValues )
		m_listOfStringValues.set_value( str );

	m_intValue.set_value( cfg.m_intValue );

	for( const auto & pair : cfg.m_vectorOfTags )
	{
		std::shared_ptr< TagVecOfTags > p( new TagVecOfTags( pair ) );
		m_vecOfTags.set_value( p );
	}

	set_defined();
}